

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.c
# Opt level: O1

ListNode * ListTail(LinkedList *list)

{
  if (list == (LinkedList *)0x0) {
    __assert_fail("list != NULL",".upnp/src/threadutil/LinkedList.c",0xeb,
                  "ListNode *ListTail(LinkedList *)");
  }
  if (list->size != 0) {
    return (list->tail).prev;
  }
  return (ListNode *)0x0;
}

Assistant:

ListNode *ListTail(LinkedList *list)
{
	assert(list != NULL);

	if (!list)
		return NULL;

	if (!list->size)
		return NULL;
	else
		return list->tail.prev;
}